

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O3

quint16 QDnsLookup::defaultPortForProtocol(Protocol protocol)

{
  quint16 qVar1;
  quint16 qVar2;
  undefined3 in_register_00000039;
  
  qVar2 = 0x355;
  if (CONCAT31(in_register_00000039,protocol) != 1) {
    qVar2 = 0;
  }
  qVar1 = 0x35;
  if (CONCAT31(in_register_00000039,protocol) != 0) {
    qVar1 = qVar2;
  }
  return qVar1;
}

Assistant:

quint16 QDnsLookup::defaultPortForProtocol(Protocol protocol) noexcept
{
    switch (protocol) {
    case QDnsLookup::Standard:
        return DnsPort;
    case QDnsLookup::DnsOverTls:
        return DnsOverTlsPort;
    }
    return 0;       // will probably fail somewhere
}